

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O0

char * ScanChars(FILE *out,size_t bufferSize,char *buffer)

{
  char *pcVar1;
  char *newlinePtr;
  char *buffer_local;
  size_t bufferSize_local;
  FILE *out_local;
  
  pcVar1 = fgets(buffer,(int)bufferSize,(FILE *)out);
  if (pcVar1 == (char *)0x0) {
    PrintWithoutBuffering("no output -- ");
    out_local = (FILE *)Fail;
  }
  else {
    pcVar1 = strchr(buffer,10);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    out_local = (FILE *)Pass;
  }
  return (char *)out_local;
}

Assistant:

const char* ScanChars(FILE* out, size_t bufferSize, char* buffer) {
    if (fgets(buffer, bufferSize, out) == NULL) {
        PrintWithoutBuffering("no output -- ");
        return Fail;
    }
    char* newlinePtr = strchr(buffer, '\n');
    if (newlinePtr != NULL) {
        *newlinePtr = '\0';
    }
    return Pass;
}